

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_set_fixed_partitioning
               (AV1_COMP *cpi,TileInfo *tile,MB_MODE_INFO **mib,int mi_row,int mi_col,
               BLOCK_SIZE bsize)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  CommonModeInfoParams *mi_params_00;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  int mi_index;
  int grid_index;
  int block_col;
  int block_row;
  int bw;
  int bh;
  MB_MODE_INFO *mi_upper_left;
  int mi_cols_remaining;
  int mi_rows_remaining;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  long lVar7;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar8;
  
  mi_params_00 = (CommonModeInfoParams *)(in_RDI + 0x3c188);
  iVar8 = *(int *)(in_RSI + 4);
  iVar1 = *(int *)(in_RSI + 0xc) - in_R8D;
  lVar7 = *(long *)(in_RDI + 0x3c1a0);
  iVar2 = get_alloc_mi_idx(mi_params_00,in_ECX,in_R8D);
  uVar3 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_R9B]
  ;
  uVar4 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R9B]
  ;
  if ((iVar1 < *(int *)(*(long *)(in_RDI + 0x42008) + 0x20)) ||
     (iVar8 - in_ECX < *(int *)(*(long *)(in_RDI + 0x42008) + 0x20))) {
    set_partial_sb_partition
              ((AV1_COMMON *)
               (ulong)CONCAT14("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [in_R9B],uVar4),
               (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,(int)((ulong)lVar7 >> 0x20),
               (int)lVar7,(BLOCK_SIZE)iVar1,(MB_MODE_INFO **)mi_params_00);
  }
  else {
    for (iVar8 = 0; iVar8 < *(int *)(*(long *)(in_RDI + 0x42008) + 0x20); iVar8 = uVar3 + iVar8) {
      for (iVar1 = 0; iVar1 < *(int *)(*(long *)(in_RDI + 0x42008) + 0x20); iVar1 = uVar4 + iVar1) {
        iVar5 = get_mi_grid_idx(mi_params_00,iVar8,iVar1);
        iVar6 = get_alloc_mi_idx(mi_params_00,iVar8,iVar1);
        *(long *)(in_RDX + (long)iVar5 * 8) = lVar7 + (long)iVar2 * 0xb0 + (long)iVar6 * 0xb0;
        **(byte **)(in_RDX + (long)iVar5 * 8) = in_R9B;
      }
    }
  }
  return;
}

Assistant:

void av1_set_fixed_partitioning(AV1_COMP *cpi, const TileInfo *const tile,
                                MB_MODE_INFO **mib, int mi_row, int mi_col,
                                BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_rows_remaining = tile->mi_row_end - mi_row;
  const int mi_cols_remaining = tile->mi_col_end - mi_col;
  MB_MODE_INFO *const mi_upper_left =
      mi_params->mi_alloc + get_alloc_mi_idx(mi_params, mi_row, mi_col);
  int bh = mi_size_high[bsize];
  int bw = mi_size_wide[bsize];

  assert(bsize >= mi_params->mi_alloc_bsize &&
         "Attempted to use bsize < mi_params->mi_alloc_bsize");
  assert((mi_rows_remaining > 0) && (mi_cols_remaining > 0));

  // Apply the requested partition size to the SB if it is all "in image"
  if ((mi_cols_remaining >= cm->seq_params->mib_size) &&
      (mi_rows_remaining >= cm->seq_params->mib_size)) {
    for (int block_row = 0; block_row < cm->seq_params->mib_size;
         block_row += bh) {
      for (int block_col = 0; block_col < cm->seq_params->mib_size;
           block_col += bw) {
        const int grid_index = get_mi_grid_idx(mi_params, block_row, block_col);
        const int mi_index = get_alloc_mi_idx(mi_params, block_row, block_col);
        mib[grid_index] = mi_upper_left + mi_index;
        mib[grid_index]->bsize = bsize;
      }
    }
  } else {
    // Else this is a partial SB.
    set_partial_sb_partition(cm, mi_upper_left, bh, bw, mi_rows_remaining,
                             mi_cols_remaining, bsize, mib);
  }
}